

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

ggml_status ggml_backend_sched_graph_compute_async(ggml_backend_sched_t sched,ggml_cgraph *graph)

{
  _Bool _Var1;
  ggml_backend_sched_t in_RSI;
  byte *in_RDI;
  ggml_backend_sched_t in_stack_000000a8;
  ggml_status local_4;
  
  if (((*in_RDI & 1) == 0) && ((in_RDI[1] & 1) == 0)) {
    ggml_backend_sched_reset((ggml_backend_sched_t)0x1621ec);
  }
  if (((in_RDI[1] & 1) != 0) ||
     (_Var1 = ggml_backend_sched_alloc_graph(in_RSI,(ggml_cgraph *)0x162205), _Var1)) {
    local_4 = ggml_backend_sched_compute_splits(in_stack_000000a8);
  }
  else {
    local_4 = GGML_STATUS_ALLOC_FAILED;
  }
  return local_4;
}

Assistant:

enum ggml_status ggml_backend_sched_graph_compute_async(ggml_backend_sched_t sched, struct ggml_cgraph * graph) {
    if (!sched->is_reset && !sched->is_alloc) {
        ggml_backend_sched_reset(sched);
    }

    if (!sched->is_alloc) {
        if (!ggml_backend_sched_alloc_graph(sched, graph)) {
            return GGML_STATUS_ALLOC_FAILED;
        }
    }

    return ggml_backend_sched_compute_splits(sched);
}